

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::set_source_buf(CTcTokenizer *this,char *buf,size_t len)

{
  int iVar1;
  CTcSrcMemory *this_00;
  CTcTokStream *pCVar2;
  
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  *(byte *)this = *(byte *)this & 0xdf;
  this->last_linenum_ = 0;
  (this->unsplicebuf_).buf_len_ = 0;
  if ((this->unsplicebuf_).buf_size_ != 0) {
    *(this->unsplicebuf_).buf_ = '\0';
  }
  this->in_quote_ = L'\0';
  this->in_triple_ = 0;
  (this->comment_in_embedding_).level = 0;
  (this->comment_in_embedding_).s = (tok_embed_level *)0x0;
  (this->macro_in_embedding_).level = 0;
  (this->macro_in_embedding_).s = (tok_embed_level *)0x0;
  (this->main_in_embedding_).level = 0;
  (this->main_in_embedding_).s = (tok_embed_level *)0x0;
  this->if_sp_ = 0;
  this->if_false_level_ = 0;
  this->unget_cur_ = (CTcTokenEle *)0x0;
  this->curbuf_ = &this->linebuf_;
  (this->p_).p_ = (this->linebuf_).buf_;
  this_00 = (CTcSrcMemory *)operator_new(0x18);
  CTcSrcMemory::CTcSrcMemory(this_00,buf,len,this->default_mapper_);
  pCVar2 = (CTcTokStream *)operator_new(0x30);
  iVar1 = this->if_sp_;
  pCVar2->src_ = (CTcSrcObject *)this_00;
  pCVar2->desc_ = (CTcTokFileDesc *)0x0;
  pCVar2->parent_ = (CTcTokStream *)0x0;
  pCVar2->next_linenum_ = 1;
  pCVar2->field_0x28 = pCVar2->field_0x28 & 0xfc;
  pCVar2->init_if_level_ = iVar1;
  this->str_ = pCVar2;
  return;
}

Assistant:

void CTcTokenizer::set_source_buf(const char *buf, size_t len)
{
    CTcSrcMemory *src;

    /* empty out the input line buffer */
    clear_linebuf();

    /* reset the scanning state to the start of a brand new stream */
    in_pp_expr_ = FALSE;
    last_linenum_ = 0;
    unsplicebuf_.clear_text();
    in_quote_ = '\0';
    in_triple_ = FALSE;
    comment_in_embedding_.reset();
    macro_in_embedding_.reset();
    main_in_embedding_.reset();
    if_sp_ = 0;
    if_false_level_ = 0;
    unget_cur_ = 0;

    /* set up at the beginning of the input line buffer */
    start_new_line(&linebuf_, 0);

    /* create a reader for the memory buffer */
    src = new CTcSrcMemory(buf, len, default_mapper_);

    /* 
     *   Create a stream to read the source file.  The new stream has no
     *   parent, because this is the top-level source file, and was not
     *   included from any other file.  
     */
    str_ = new CTcTokStream(0, src, 0, 0, if_sp_);
}